

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall
bsplib::Rdma::Rdma(Rdma *this,MPI_Comm comm,size_t max_msg_size,size_t small_exch_size,double alpha,
                  double beta,size_t min_n_hp_msg_size,Method method)

{
  int iVar1;
  Memslot MVar2;
  Method method_local;
  size_t min_n_hp_msg_size_local;
  double beta_local;
  double alpha_local;
  size_t small_exch_size_local;
  size_t max_msg_size_local;
  MPI_Comm comm_local;
  Rdma *this_local;
  
  A2A::A2A(&this->m_first_exchange,comm,max_msg_size,small_exch_size,alpha,beta,method);
  A2A::A2A(&this->m_second_exchange,comm,max_msg_size,small_exch_size,alpha,beta,method);
  iVar1 = A2A::pid(&this->m_first_exchange);
  this->m_pid = iVar1;
  iVar1 = A2A::nprocs(&this->m_first_exchange);
  this->m_nprocs = iVar1;
  this->m_min_n_hp_msg_size = min_n_hp_msg_size;
  *(undefined8 *)&(this->m_register)._M_h._M_rehash_policy = 0;
  (this->m_register)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_register)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_register)._M_h._M_element_count = 0;
  (this->m_register)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->m_register)._M_h._M_bucket_count = 0;
  (this->m_register)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<void_*,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::unordered_map(&this->m_register);
  (this->m_used_slots).
  super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_used_slots).
  super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_used_slots).
  super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::vector
            (&this->m_used_slots);
  (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_free_slots);
  MVar2 = no_slot();
  this->m_cached_slot = MVar2;
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->m_local_slots);
  ActionBuf::ActionBuf(&this->m_send_actions,this->m_nprocs);
  ActionBuf::ActionBuf(&this->m_recv_actions,this->m_nprocs);
  Unbuf::Unbuf(&this->m_unbuf,max_msg_size,comm);
  memset(&this->m_send_push_pop_comm_buf,0,0x30);
  PushPopCommBuf::PushPopCommBuf(&this->m_send_push_pop_comm_buf);
  memset(&this->m_recv_push_pop_comm_buf,0,0x30);
  PushPopCommBuf::PushPopCommBuf(&this->m_recv_push_pop_comm_buf);
  return;
}

Assistant:

Rdma :: Rdma( MPI_Comm comm, size_t max_msg_size, size_t small_exch_size,
      double alpha, double beta, size_t min_n_hp_msg_size,
      A2A::Method method  )
    : m_first_exchange( comm, max_msg_size, small_exch_size, 
                        alpha, beta, method )
    , m_second_exchange( comm, max_msg_size, small_exch_size,
                        alpha, beta, method )
    , m_pid(m_first_exchange.pid())
    , m_nprocs(m_first_exchange.nprocs())
    , m_min_n_hp_msg_size( min_n_hp_msg_size )
    , m_register()
    , m_used_slots()
    , m_free_slots()
    , m_cached_slot( no_slot() )
    , m_send_actions( m_nprocs )
    , m_recv_actions( m_nprocs )
    , m_unbuf( max_msg_size, comm )
    , m_send_push_pop_comm_buf()
    , m_recv_push_pop_comm_buf()
#ifdef PROFILE
    , m_tictoc( TicToc :: TOTAL )
#endif
{}